

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O2

void put_rgb(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  J_COLOR_SPACE JVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  JDIMENSION JVar6;
  ppm_dest_ptr dest;
  _func_void_j_decompress_ptr_djpeg_dest_ptr *p_Var7;
  JSAMPROW pJVar8;
  bool bVar9;
  
  JVar1 = cinfo->out_color_space;
  JVar6 = cinfo->output_width;
  iVar2 = rgb_red[JVar1];
  iVar3 = rgb_green[JVar1];
  iVar4 = rgb_blue[JVar1];
  iVar5 = rgb_pixelsize[JVar1];
  p_Var7 = dinfo[1].start_output;
  pJVar8 = *dinfo->buffer;
  while (bVar9 = JVar6 != 0, JVar6 = JVar6 - 1, bVar9) {
    *p_Var7 = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar8[iVar2];
    p_Var7[1] = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar8[iVar3];
    p_Var7[2] = (_func_void_j_decompress_ptr_djpeg_dest_ptr)pJVar8[iVar4];
    p_Var7 = p_Var7 + 3;
    pJVar8 = pJVar8 + iVar5;
  }
  fwrite(dinfo[1].start_output,1,(size_t)dinfo[1].finish_output,(FILE *)dinfo->output_file);
  return;
}

Assistant:

METHODDEF(void)
put_rgb(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo, JDIMENSION rows_supplied)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;
  register char *bufferptr;
  register JSAMPROW ptr;
  register JDIMENSION col;
  register int rindex = rgb_red[cinfo->out_color_space];
  register int gindex = rgb_green[cinfo->out_color_space];
  register int bindex = rgb_blue[cinfo->out_color_space];
  register int ps = rgb_pixelsize[cinfo->out_color_space];

  ptr = dest->pub.buffer[0];
  bufferptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    PUTPPMSAMPLE(bufferptr, ptr[rindex]);
    PUTPPMSAMPLE(bufferptr, ptr[gindex]);
    PUTPPMSAMPLE(bufferptr, ptr[bindex]);
    ptr += ps;
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}